

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O0

int l2_cast_octal_str_to_int(char *s)

{
  size_t sVar1;
  int local_2c;
  int local_28;
  int ans_1;
  int i;
  int factor;
  int n;
  int ans;
  char *p;
  char *s_local;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_octal_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0x1e);
  factor = 0;
  sVar1 = strlen(s);
  i = (int)sVar1;
  for (_n = s; *_n != '\0'; _n = _n + 1) {
    local_2c = 1;
    for (local_28 = 0; local_28 < i + -1; local_28 = local_28 + 1) {
      local_2c = local_2c << 3;
    }
    factor = local_2c * (*_n + -0x30) + factor;
    i = i + -1;
  }
  return factor;
}

Assistant:

int l2_cast_octal_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        ans += factor * (*p - '0');
        n -= 1;
    }
    return ans;
}